

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadCamera(ColladaParser *this,Camera *pCamera)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pName;
  ai_real aVar3;
  
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
            if ((char)iVar2 == '\0') {
              return;
            }
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar2 == 1) break;
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar2 == 2) {
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"camera");
              if (iVar2 == 0) {
                return;
              }
            }
          }
          bVar1 = IsElement(this,"camera");
          if (!bVar1) break;
          SkipElement(this);
        }
        bVar1 = IsElement(this,"orthographic");
        if (!bVar1) break;
        pCamera->mOrtho = true;
      }
      bVar1 = IsElement(this,"xfov");
      if ((!bVar1) && (bVar1 = IsElement(this,"xmag"), !bVar1)) break;
      aVar3 = ReadFloatFromTextContent(this);
      pCamera->mHorFov = aVar3;
      pName = "xfov";
      if (pCamera->mOrtho != false) {
        pName = "xmag";
      }
LAB_003fbd0a:
      TestClosing(this,pName);
    }
    bVar1 = IsElement(this,"yfov");
    if ((bVar1) || (bVar1 = IsElement(this,"ymag"), bVar1)) {
      aVar3 = ReadFloatFromTextContent(this);
      pCamera->mVerFov = aVar3;
      pName = "yfov";
      if (pCamera->mOrtho != false) {
        pName = "ymag";
      }
      goto LAB_003fbd0a;
    }
    bVar1 = IsElement(this,"aspect_ratio");
    if (bVar1) {
      aVar3 = ReadFloatFromTextContent(this);
      pCamera->mAspect = aVar3;
      TestClosing(this,"aspect_ratio");
    }
    else {
      bVar1 = IsElement(this,"znear");
      if (bVar1) {
        aVar3 = ReadFloatFromTextContent(this);
        pCamera->mZNear = aVar3;
        TestClosing(this,"znear");
      }
      else {
        bVar1 = IsElement(this,"zfar");
        if (bVar1) {
          aVar3 = ReadFloatFromTextContent(this);
          pCamera->mZFar = aVar3;
          TestClosing(this,"zfar");
        }
      }
    }
  } while( true );
}

Assistant:

void ColladaParser::ReadCamera(Collada::Camera& pCamera)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("camera")) {
                SkipElement();
            }
            else if (IsElement("orthographic")) {
                pCamera.mOrtho = true;
            }
            else if (IsElement("xfov") || IsElement("xmag")) {
                pCamera.mHorFov = ReadFloatFromTextContent();
                TestClosing((pCamera.mOrtho ? "xmag" : "xfov"));
            }
            else if (IsElement("yfov") || IsElement("ymag")) {
                pCamera.mVerFov = ReadFloatFromTextContent();
                TestClosing((pCamera.mOrtho ? "ymag" : "yfov"));
            }
            else if (IsElement("aspect_ratio")) {
                pCamera.mAspect = ReadFloatFromTextContent();
                TestClosing("aspect_ratio");
            }
            else if (IsElement("znear")) {
                pCamera.mZNear = ReadFloatFromTextContent();
                TestClosing("znear");
            }
            else if (IsElement("zfar")) {
                pCamera.mZFar = ReadFloatFromTextContent();
                TestClosing("zfar");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "camera") == 0)
                break;
        }
    }
}